

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yv12extend.c
# Opt level: O3

void extend_plane(uint8_t *src,int src_stride,int width,int height,int extend_top,int extend_left,
                 int extend_bottom,int extend_right,int v_start,int v_end)

{
  long lVar1;
  byte *pbVar2;
  size_t __n;
  long lVar3;
  size_t __n_00;
  uint8_t *puVar4;
  uint8_t *__src;
  int iVar5;
  
  __n_00 = (size_t)extend_left;
  lVar3 = (long)src_stride;
  iVar5 = v_end - v_start;
  if (iVar5 != 0 && v_start <= v_end) {
    pbVar2 = src + v_start * src_stride;
    do {
      memset(pbVar2 + -__n_00,(uint)*pbVar2,__n_00);
      memset(pbVar2 + width,(uint)pbVar2[(long)width + -1],(long)extend_right);
      pbVar2 = pbVar2 + lVar3;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  __src = src + -__n_00;
  __n = (size_t)(extend_left + width + extend_right);
  if (0 < extend_top) {
    puVar4 = __src + -(src_stride * extend_top);
    do {
      memcpy(puVar4,__src,__n);
      puVar4 = puVar4 + lVar3;
      extend_top = extend_top + -1;
    } while (extend_top != 0);
  }
  if (0 < extend_bottom) {
    lVar1 = (long)(src_stride * (height + -1));
    puVar4 = src + ((lVar1 + lVar3) - __n_00);
    do {
      memcpy(puVar4,__src + lVar1,__n);
      puVar4 = puVar4 + lVar3;
      extend_bottom = extend_bottom + -1;
    } while (extend_bottom != 0);
  }
  return;
}

Assistant:

static void extend_plane(uint8_t *const src, int src_stride, int width,
                         int height, int extend_top, int extend_left,
                         int extend_bottom, int extend_right, int v_start,
                         int v_end) {
  assert(src != NULL);
  int i;
  const int linesize = extend_left + extend_right + width;
  assert(linesize <= src_stride);

  /* copy the left and right most columns out */
  uint8_t *src_ptr1 = src + v_start * src_stride;
  uint8_t *src_ptr2 = src + v_start * src_stride + width - 1;
  uint8_t *dst_ptr1 = src + v_start * src_stride - extend_left;
  uint8_t *dst_ptr2 = src_ptr2 + 1;

  for (i = v_start; i < v_end; ++i) {
    memset(dst_ptr1, src_ptr1[0], extend_left);
    memset(dst_ptr2, src_ptr2[0], extend_right);
    src_ptr1 += src_stride;
    src_ptr2 += src_stride;
    dst_ptr1 += src_stride;
    dst_ptr2 += src_stride;
  }

  /* Now copy the top and bottom lines into each line of the respective
   * borders
   */
  src_ptr1 = src - extend_left;
  dst_ptr1 = src_ptr1 + src_stride * -extend_top;

  for (i = 0; i < extend_top; ++i) {
    memcpy(dst_ptr1, src_ptr1, linesize);
    dst_ptr1 += src_stride;
  }

  src_ptr2 = src_ptr1 + src_stride * (height - 1);
  dst_ptr2 = src_ptr2;

  for (i = 0; i < extend_bottom; ++i) {
    dst_ptr2 += src_stride;
    memcpy(dst_ptr2, src_ptr2, linesize);
  }
}